

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhugeint.cpp
# Opt level: O2

bool __thiscall duckdb::uhugeint_t::operator_cast_to_bool(uhugeint_t *this)

{
  uhugeint_t local_20;
  
  uhugeint_t(&local_20,0);
  return this->upper != local_20.upper || this->lower != local_20.lower;
}

Assistant:

uhugeint_t::operator bool() const {
	return *this != 0;
}